

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rprog.c
# Opt level: O3

bool open_prog_mudschool_key(ROOM_INDEX_DATA *room,CHAR_DATA *ch,EXIT_DATA *exit)

{
  OBJ_INDEX_DATA *pObjIndex;
  OBJ_DATA *pOVar1;
  bool bVar2;
  
  pOVar1 = ch->carrying;
  while( true ) {
    if (pOVar1 == (OBJ_DATA *)0x0) {
      bVar2 = (exit->exit_info[0] & 4) != 0;
      if (bVar2) {
        pObjIndex = get_obj_index(0);
        pOVar1 = create_object(pObjIndex,1);
        send_to_char("It\'s locked...\n\r",ch);
        obj_to_char(pOVar1,ch);
        act("With a sudden flash of lavender light, a pudgy hand pops into existence and gives you a key!"
            ,ch,(void *)0x0,(void *)0x0,3);
        act("With a sudden flash of lavender light, a pudgy hand pops into existence gives $n a key!"
            ,ch,(void *)0x0,(void *)0x0,0);
      }
      return !bVar2;
    }
    if (pOVar1->pIndexData->vnum == 0x6014) break;
    pOVar1 = pOVar1->next_content;
  }
  return true;
}

Assistant:

bool open_prog_mudschool_key(ROOM_INDEX_DATA *room, CHAR_DATA *ch, EXIT_DATA *exit)
{
	OBJ_DATA *obj, *obj2;
	bool found= false;

	for (obj2 = ch->carrying; obj2 != nullptr; obj2 = obj2->next_content)
	{
		if (obj2->pIndexData->vnum == 24596)
		{
			found = true;
			break;
		}
	}

	if (found)
		return true;

	if (!IS_SET(exit->exit_info, EX_LOCKED))
		return true;

	obj = create_object(get_obj_index(24596), 1);
	send_to_char("It's locked...\n\r", ch);
	obj_to_char(obj, ch);
	act("With a sudden flash of lavender light, a pudgy hand pops into existence and gives you a key!", ch, 0, 0, TO_CHAR);
	act("With a sudden flash of lavender light, a pudgy hand pops into existence gives $n a key!", ch, 0, 0, TO_ROOM);

	return false;
}